

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysc_when ** lysc_node_when(lysc_node *node)

{
  lysc_when ***ppplVar1;
  lysc_when **pplVar2;
  
  ppplVar1 = lysc_node_when_p(node);
  if (ppplVar1 == (lysc_when ***)0x0) {
    pplVar2 = (lysc_when **)0x0;
  }
  else {
    pplVar2 = *ppplVar1;
  }
  return pplVar2;
}

Assistant:

lysc_when **
lysc_node_when(const struct lysc_node *node)
{
    struct lysc_when ***when_p;

    when_p = lysc_node_when_p(node);
    if (when_p) {
        return *when_p;
    } else {
        return NULL;
    }
}